

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O3

int64_t av1_rd_pick_intra_sbuv_mode
                  (AV1_COMP *cpi,MACROBLOCK *x,int *rate,int *rate_tokenonly,int64_t *distortion,
                  uint8_t *skippable,BLOCK_SIZE bsize,TX_SIZE max_tx_size)

{
  int (*paaiVar1) [13] [14];
  byte bVar2;
  BLOCK_SIZE BVar3;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO *pMVar4;
  int64_t iVar5;
  byte tx_size;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  _Bool *p_Var11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  byte bVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  buf_2d *ref;
  RD_STATS *pRVar20;
  int cfl_linear_idx;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  long local_c70;
  long local_c50;
  RD_STATS tokenonly_rd_stats;
  int64_t local_c18;
  int64_t best_rd;
  int (*local_be0) [13] [14];
  _Bool *local_bd8;
  ulong local_bd0;
  MACROBLOCKD *local_bc8;
  undefined1 *local_bc0;
  ulong local_bb8;
  ulong local_bb0;
  IntraModeSearchState intra_search_state;
  MB_MODE_INFO best_mbmi;
  RD_STATS cfl_rd_arr_u [33];
  RD_STATS local_558 [33];
  
  mbmi = *(x->e_mbd).mi;
  memcpy(&best_mbmi,mbmi,0xb0);
  best_rd = 0x7fffffffffffffff;
  mbmi->uv_mode = '\0';
  (mbmi->palette_mode_info).palette_size[1] = '\0';
  if ((x->e_mbd).is_chroma_ref == false) {
    *rate = 0;
    *rate_tokenonly = 0;
    *distortion = 0;
    *skippable = '\x01';
    return 0x7fffffffffffffff;
  }
  if (((cpi->common).seq_params)->monochrome == '\0') {
    pMVar4 = *(x->e_mbd).mi;
    uVar10 = (ulong)pMVar4->bsize;
    if ((x->e_mbd).lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0) {
      bVar23 = (0x2f0bffUL >> (uVar10 & 0x3f) & 1) != 0;
      if ((0x1f07ffUL >> (uVar10 & 0x3f) & 1) == 0) goto LAB_0024aa49;
    }
    else {
      bVar23 = av1_ss_size_lookup[uVar10][(x->e_mbd).plane[1].subsampling_x]
               [(x->e_mbd).plane[1].subsampling_y] == BLOCK_4X4;
    }
    (x->e_mbd).cfl.store_y = (uint)bVar23;
    if (bVar23 == false) goto LAB_0024aa4f;
    av1_encode_intra_block_plane
              (cpi,x,mbmi->bsize,0,'\x01',cpi->optimize_seg_arr[*(ushort *)&mbmi->field_0xa7 & 7]);
  }
LAB_0024aa49:
  (x->e_mbd).cfl.store_y = 0;
LAB_0024aa4f:
  intra_search_state.directional_mode_skip_mask[8] = '\0';
  intra_search_state.directional_mode_skip_mask[9] = '\0';
  intra_search_state.directional_mode_skip_mask[10] = '\0';
  intra_search_state.directional_mode_skip_mask[0xb] = '\0';
  intra_search_state.directional_mode_skip_mask[0xc] = '\0';
  intra_search_state._21_3_ = 0;
  intra_search_state.pmi_uv.palette_colors[0xf] = 0;
  intra_search_state.pmi_uv.palette_colors[0x10] = 0;
  intra_search_state.pmi_uv.palette_colors[0x11] = 0;
  intra_search_state.pmi_uv.palette_colors[0x12] = 0;
  intra_search_state.pmi_uv.palette_colors[0x13] = 0;
  intra_search_state.pmi_uv.palette_colors[0x14] = 0;
  intra_search_state.pmi_uv.palette_colors[0x15] = 0;
  intra_search_state.pmi_uv.palette_colors[0x16] = 0;
  intra_search_state.pmi_uv.palette_colors[7] = 0;
  intra_search_state.pmi_uv.palette_colors[8] = 0;
  intra_search_state.pmi_uv.palette_colors[9] = 0;
  intra_search_state.pmi_uv.palette_colors[10] = 0;
  intra_search_state.pmi_uv.palette_colors[0xb] = 0;
  intra_search_state.pmi_uv.palette_colors[0xc] = 0;
  intra_search_state.pmi_uv.palette_colors[0xd] = 0;
  intra_search_state.pmi_uv.palette_colors[0xe] = 0;
  intra_search_state.skip_uvs = '\0';
  intra_search_state.mode_uv = '\0';
  intra_search_state.pmi_uv.palette_colors[0] = 0;
  intra_search_state.pmi_uv.palette_colors[1] = 0;
  intra_search_state.pmi_uv.palette_colors[2] = 0;
  intra_search_state.pmi_uv.palette_colors[3] = 0;
  intra_search_state.pmi_uv.palette_colors[4] = 0;
  intra_search_state.pmi_uv.palette_colors[5] = 0;
  intra_search_state.pmi_uv.palette_colors[6] = 0;
  intra_search_state.rate_uv_tokenonly = 0;
  intra_search_state._36_4_ = 0;
  intra_search_state.dist_uvs = 0;
  intra_search_state.best_intra_mode = '\0';
  intra_search_state._1_3_ = 0;
  intra_search_state.skip_intra_modes = 0;
  intra_search_state.directional_mode_skip_mask[0] = '\0';
  intra_search_state.directional_mode_skip_mask[1] = '\0';
  intra_search_state.directional_mode_skip_mask[2] = '\0';
  intra_search_state.directional_mode_skip_mask[3] = '\0';
  intra_search_state.directional_mode_skip_mask[4] = '\0';
  intra_search_state.directional_mode_skip_mask[5] = '\0';
  intra_search_state.directional_mode_skip_mask[6] = '\0';
  intra_search_state.directional_mode_skip_mask[7] = '\0';
  intra_search_state.pmi_uv.palette_colors[0x17] = 0;
  intra_search_state.pmi_uv.palette_size[0] = '\0';
  intra_search_state.pmi_uv.palette_size[1] = '\0';
  intra_search_state.uv_angle_delta = '\0';
  intra_search_state._101_3_ = 0;
  intra_search_state.dir_mode_skip_mask_ready = 0;
  intra_search_state.rate_uv_intra = 0x7fffffff;
  pMVar4 = *(x->e_mbd).mi;
  uVar10 = (ulong)pMVar4->bsize;
  if ((x->e_mbd).lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0) {
    uVar12 = (uint)((0x2f0bffUL >> (uVar10 & 0x3f) & 1) != 0);
    if ((0x1f07ffUL >> (uVar10 & 0x3f) & 1) == 0) {
      uVar12 = 0;
    }
  }
  else {
    uVar12 = (uint)(av1_ss_size_lookup[uVar10][(x->e_mbd).plane[1].subsampling_x]
                    [(x->e_mbd).plane[1].subsampling_y] == BLOCK_4X4);
  }
  local_bc8 = &x->e_mbd;
  paaiVar1 = (x->mode_costs).intra_uv_mode_cost;
  uVar10 = (ulong)uVar12;
  local_bb0 = (ulong)max_tx_size;
  local_bd8 = (_Bool *)&mbmi->cfl_alpha_signs;
  local_c50 = 0x7fffffffffffffff;
  local_c70 = 0x7fffffffffffffff;
  bVar23 = false;
  uVar15 = 0;
  local_be0 = paaiVar1;
  local_bd0 = uVar10;
  do {
    bVar2 = ""[uVar15];
    if ((long)x->rdmult * (long)paaiVar1[uVar10][mbmi->mode][bVar2] + 0x100 >> 9 <= local_c70) {
      bVar16 = get_uv_mode_uv2y[bVar2] - 9;
      if (bVar16 < 0xfa) {
        if (0xf7 < bVar16) {
LAB_0024ac05:
          if ((cpi->oxcf).intra_mode_cfg.enable_directional_intra != true) goto LAB_0024ac97;
        }
        if ((((((uint)(cpi->sf).intra_sf.intra_uv_mode_mask[""[local_bb0]] >> (bVar2 & 0x1f) & 1) !=
               0) && (((((uint)uVar15 & 0xb) == 1 ||
                       ((cpi->oxcf).intra_mode_cfg.enable_smooth_intra != false)) ||
                      ((0xf2UL >> (uVar15 & 0x3f) & 1) == 0)))) &&
            ((uVar15 != 5 || ((cpi->oxcf).intra_mode_cfg.enable_paeth_intra != false)))) &&
           (((cpi->sf).intra_sf.prune_chroma_modes_using_luma_winner == 0 ||
            ((1 << (bVar2 & 0x1f) & (uint)av1_derived_chroma_intra_mode_used_flag[mbmi->mode]) != 0)
            ))) {
          mbmi->uv_mode = bVar2;
          mbmi->angle_delta[1] = '\0';
          if (uVar15 == 1) {
            if ((local_bd0 != 0) && ((cpi->oxcf).intra_mode_cfg.enable_cfl_intra == true)) {
              pMVar4 = *(x->e_mbd).mi;
              if ((x->e_mbd).lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0) {
                bVar16 = ""[av1_ss_size_lookup[pMVar4->bsize][(x->e_mbd).plane[1].subsampling_x]
                            [(x->e_mbd).plane[1].subsampling_y]];
                if (bVar16 < 0x11) {
                  tx_size = 3;
                  if ((1 < bVar16 - 0xb) && (tx_size = 3, bVar16 != 4)) {
LAB_0024b5ee:
                    tx_size = bVar16;
                  }
                }
                else if (bVar16 == 0x11) {
                  tx_size = 9;
                }
                else {
                  if (bVar16 != 0x12) goto LAB_0024b5ee;
                  tx_size = 10;
                }
              }
              else {
                tx_size = 0;
              }
              iVar9 = (cpi->sf).intra_sf.cfl_search_range;
              tokenonly_rd_stats.rate = 0x7fffffff;
              tokenonly_rd_stats.zero_rate = 0;
              tokenonly_rd_stats.dist = 0x7fffffffffffffff;
              tokenonly_rd_stats.rdcost = 0x7fffffffffffffff;
              tokenonly_rd_stats.sse = 0x7fffffffffffffff;
              tokenonly_rd_stats.skip_txfm = '\0';
              (x->e_mbd).cfl.use_dc_pred_cache = true;
              iVar7 = cfl_pick_plane_parameter(cpi,x,1,tx_size,iVar9);
              iVar8 = cfl_pick_plane_parameter(cpi,x,2,tx_size,iVar9);
              if (iVar9 == 1) {
                if (iVar8 == 0x10 && iVar7 == 0x10) {
                  mbmi->cfl_alpha_signs = '\0';
                  mbmi->cfl_alpha_idx = '\0';
                }
                else {
                  iVar17 = iVar7 + -0x10;
                  if (iVar17 == 0) {
                    lVar14 = -1;
                    lVar22 = 0;
                  }
                  else {
                    iVar13 = -iVar17;
                    if (0 < iVar17) {
                      iVar13 = iVar17;
                    }
                    lVar22 = (long)(iVar13 + -1);
                    lVar14 = (ulong)(0x10 < iVar7) * 3 + 2;
                  }
                  lVar18 = 0;
                  iVar17 = iVar8 + -0x10;
                  if (iVar17 == 0) {
                    lVar19 = 0;
                  }
                  else {
                    iVar13 = -iVar17;
                    if (0 < iVar17) {
                      iVar13 = iVar17;
                    }
                    lVar18 = (ulong)(0x10 < iVar8) + 1;
                    lVar19 = (long)(iVar13 + -1);
                  }
                  pMVar4 = *(x->e_mbd).mi;
                  BVar3 = pMVar4->bsize;
                  if ((x->e_mbd).lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0) {
                    uVar21 = (ulong)((uint)(0x1f07ffL >> (BVar3 & 0x3f)) &
                                     (uint)(0x2f0bffL >> (BVar3 & 0x3f)) & 1);
                  }
                  else {
                    uVar21 = (ulong)(av1_ss_size_lookup[BVar3][(x->e_mbd).plane[1].subsampling_x]
                                     [(x->e_mbd).plane[1].subsampling_y] == BLOCK_4X4);
                  }
                  if ((long)x->rdmult *
                      ((long)local_be0[uVar21][pMVar4->mode][0xd] +
                      (long)(x->mode_costs).cfl_cost[lVar18 + lVar14][1][lVar19] +
                      (long)(x->mode_costs).cfl_cost[lVar18 + lVar14][0][lVar22]) + 0x100 >> 9 <=
                      local_c70) goto LAB_0024b28a;
                  mbmi->cfl_alpha_signs = '\0';
                  mbmi->cfl_alpha_idx = '\0';
                }
                (x->e_mbd).cfl.use_dc_pred_cache = false;
                (x->e_mbd).cfl.dc_pred_is_cached[0] = false;
                p_Var11 = (x->e_mbd).cfl.dc_pred_is_cached + 1;
              }
              else {
LAB_0024b28a:
                cfl_pick_plane_rd(cpi,x,1,tx_size,iVar9,cfl_rd_arr_u,iVar7);
                cfl_pick_plane_rd(cpi,x,2,tx_size,iVar9,local_558,iVar8);
                (x->e_mbd).cfl.use_dc_pred_cache = false;
                (x->e_mbd).cfl.dc_pred_is_cached[0] = false;
                (x->e_mbd).cfl.dc_pred_is_cached[1] = false;
                local_c18 = tokenonly_rd_stats.rdcost;
                uVar21 = 0;
                do {
                  local_bb8 = uVar21;
                  iVar9 = cfl_rd_arr_u[local_bb8].rate;
                  if ((long)iVar9 != 0x7fffffff) {
                    if (local_bb8 - 0x10 == 0) {
                      cVar6 = '\0';
                      iVar7 = 0;
                    }
                    else {
                      cVar6 = '\x02' - (local_bb8 < 0x11);
                      iVar8 = (int)(local_bb8 - 0x10);
                      iVar7 = -iVar8;
                      if (0 < iVar8) {
                        iVar7 = iVar8;
                      }
                      iVar7 = iVar7 + -1;
                    }
                    local_bc0 = &cfl_rd_arr_u[local_bb8].field_0x21;
                    lVar14 = -0x10;
                    pRVar20 = local_558;
                    do {
                      if ((long)pRVar20->rate != 0x7fffffff) {
                        if (lVar14 == 0) {
                          iVar8 = 0;
                          iVar17 = 0;
                          if (cVar6 == '\0') goto LAB_0024b45b;
                        }
                        else {
                          iVar17 = (int)lVar14;
                          iVar8 = -iVar17;
                          if (0 < iVar17) {
                            iVar8 = iVar17;
                          }
                          iVar8 = iVar8 + -1;
                          iVar17 = 2 - (uint)(lVar14 + 0x10U < 0x11);
                        }
                        iVar13 = cfl_rd_arr_u[local_bb8].zero_rate;
                        lVar22 = (long)pRVar20->rate + (long)iVar9;
                        if (0x7ffffffe < lVar22) {
                          lVar22 = 0x7fffffff;
                        }
                        if (iVar13 == 0) {
                          iVar13 = pRVar20->zero_rate;
                        }
                        lVar18 = 0x7fffffffffffffff;
                        if (cfl_rd_arr_u[local_bb8].sse != 0x7fffffffffffffff) {
                          lVar18 = 0;
                          if (pRVar20->sse != 0x7fffffffffffffff) {
                            lVar18 = pRVar20->sse;
                          }
                          lVar18 = lVar18 + cfl_rd_arr_u[local_bb8].sse;
                        }
                        if ((int)lVar22 != 0x7fffffff) {
                          iVar17 = iVar17 + ((byte)(cVar6 * '\x03') - 1);
                          uVar12 = (int)lVar22 + (x->mode_costs).cfl_cost[iVar17][0][iVar7] +
                                   (x->mode_costs).cfl_cost[iVar17][1][iVar8];
                          if (((uVar12 != 0x7fffffff) &&
                              (lVar22 = cfl_rd_arr_u[local_bb8].dist + pRVar20->dist,
                              lVar22 != 0x7fffffffffffffff)) &&
                             (cfl_rd_arr_u[local_bb8].rdcost != 0x7fffffffffffffff)) {
                            if ((int)uVar12 < 0) {
                              lVar19 = lVar22 * 0x80 -
                                       ((long)((ulong)-uVar12 * (long)x->rdmult + 0x100) >> 9);
                            }
                            else {
                              lVar19 = lVar22 * 0x80 +
                                       ((long)((ulong)uVar12 * (long)x->rdmult + 0x100) >> 9);
                            }
                            if (lVar19 < local_c18) {
                              tokenonly_rd_stats.skip_txfm =
                                   cfl_rd_arr_u[local_bb8].skip_txfm & pRVar20->skip_txfm;
                              tokenonly_rd_stats.zero_rate = iVar13;
                              tokenonly_rd_stats.rate = uVar12;
                              tokenonly_rd_stats._33_4_ = *(undefined4 *)local_bc0;
                              tokenonly_rd_stats._37_3_ =
                                   SUB43((uint)*(undefined4 *)&cfl_rd_arr_u[local_bb8].field_0x24 >>
                                         8,0);
                              mbmi->cfl_alpha_idx = (char)iVar8 + (char)(iVar7 << 4);
                              mbmi->cfl_alpha_signs = (int8_t)iVar17;
                              tokenonly_rd_stats.dist = lVar22;
                              tokenonly_rd_stats.rdcost = lVar19;
                              tokenonly_rd_stats.sse = lVar18;
                              local_c18 = lVar19;
                            }
                          }
                        }
                      }
LAB_0024b45b:
                      lVar14 = lVar14 + 1;
                      pRVar20 = pRVar20 + 1;
                    } while (lVar14 != 0x11);
                  }
                  uVar21 = local_bb8 + 1;
                } while (local_bb8 + 1 != 0x21);
                if (local_c18 < local_c70) {
LAB_0024b01b:
                  lVar22 = (long)tokenonly_rd_stats.rate;
                  iVar9 = intra_mode_info_cost_uv
                                    (cpi,x,mbmi,bsize,paaiVar1[uVar10][mbmi->mode][bVar2]);
                  iVar5 = tokenonly_rd_stats.dist;
                  lVar14 = tokenonly_rd_stats.dist * 0x80 +
                           ((long)x->rdmult * (iVar9 + lVar22) + 0x100 >> 9);
                  local_c70 = local_c50;
                  if (lVar14 < local_c50) {
                    memcpy(&best_mbmi,mbmi,0xb0);
                    *rate = (int)(iVar9 + lVar22);
                    *rate_tokenonly = tokenonly_rd_stats.rate;
                    *distortion = iVar5;
                    *skippable = tokenonly_rd_stats.skip_txfm;
                    local_c70 = lVar14;
                    local_c50 = lVar14;
                    best_rd = lVar14;
                  }
                  goto LAB_0024ac97;
                }
                tokenonly_rd_stats.rate = 0x7fffffff;
                tokenonly_rd_stats.zero_rate = 0;
                tokenonly_rd_stats.dist = 0x7fffffffffffffff;
                tokenonly_rd_stats.rdcost = 0x7fffffffffffffff;
                tokenonly_rd_stats.sse = 0x7fffffffffffffff;
                tokenonly_rd_stats.skip_txfm = '\0';
                mbmi->cfl_alpha_idx = '\0';
                p_Var11 = local_bd8;
              }
              *p_Var11 = false;
            }
          }
          else if (((bVar16 < 0xf8) || (mbmi->bsize < BLOCK_8X8)) ||
                  ((cpi->oxcf).intra_mode_cfg.enable_angle_delta != true)) {
            if ((uVar15 != 4) || ((cpi->sf).intra_sf.prune_smooth_intra_mode_for_chroma != true)) {
LAB_0024afec:
              iVar9 = av1_txfm_uvrd(cpi,x,&tokenonly_rd_stats,bsize,local_c70);
              goto joined_r0x0024b015;
            }
            if (((cpi->common).seq_params)->monochrome == '\0') {
              uVar21 = 1;
              ref = &x->plane[1].src;
              do {
                uVar12 = av1_get_perpixel_variance_facade(cpi,local_bc8,ref,bsize,(int)uVar21);
                if (0x13 < uVar12) goto LAB_0024afec;
                if (1 < uVar21) break;
                uVar21 = uVar21 + 1;
                ref = (buf_2d *)&ref[4].buf0;
              } while (((cpi->common).seq_params)->monochrome == '\0');
            }
          }
          else {
            lVar14 = (long)(cpi->sf).intra_sf.chroma_intra_pruning_with_hog;
            if (!bVar23 && lVar14 != 0) {
              bVar23 = true;
              prune_intra_mode_with_hog
                        (x,bsize,((cpi->common).seq_params)->sb_size,
                         *(float *)("\x01\x03\x05\x01\x01\x01\t\x01\x01\x01\x01\x01\x11" +
                                   lVar14 * 4 +
                                   (ulong)(((cpi->common).current_frame.frame_type & 0xfd) == 0) *
                                   0x10 + 9),intra_search_state.directional_mode_skip_mask,1);
              intra_search_state.dir_mode_skip_mask_ready = 1;
            }
            if (intra_search_state.directional_mode_skip_mask[bVar2] == '\0') {
              iVar9 = rd_pick_intra_angle_sbuv
                                (cpi,x,bsize,paaiVar1[uVar10][mbmi->mode][bVar2],local_c70,
                                 &cfl_rd_arr_u[0].rate,&tokenonly_rd_stats);
joined_r0x0024b015:
              if (iVar9 != 0) goto LAB_0024b01b;
            }
          }
        }
      }
      else if ((cpi->oxcf).intra_mode_cfg.enable_diagonal_intra != false) goto LAB_0024ac05;
    }
LAB_0024ac97:
    uVar15 = uVar15 + 1;
    if (uVar15 == 0xe) {
      if ((((cpi->oxcf).tool_cfg.enable_palette != false) &&
          ((cpi->common).features.allow_screen_content_tools != false)) &&
         ((0xf < mbmi->bsize || ((0xe007U >> (mbmi->bsize & 0x1f) & 1) == 0)))) {
        av1_rd_pick_palette_intra_sbuv
                  (cpi,x,paaiVar1[uVar10][mbmi->mode][0],x->palette_buffer->best_palette_color_map,
                   &best_mbmi,&best_rd,rate,rate_tokenonly,distortion,skippable);
        local_c50 = best_rd;
      }
      memcpy(mbmi,&best_mbmi,0xb0);
      return local_c50;
    }
  } while( true );
}

Assistant:

int64_t av1_rd_pick_intra_sbuv_mode(const AV1_COMP *const cpi, MACROBLOCK *x,
                                    int *rate, int *rate_tokenonly,
                                    int64_t *distortion, uint8_t *skippable,
                                    BLOCK_SIZE bsize, TX_SIZE max_tx_size) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  MB_MODE_INFO best_mbmi = *mbmi;
  int64_t best_rd = INT64_MAX, this_rd;
  const ModeCosts *mode_costs = &x->mode_costs;
  const IntraModeCfg *const intra_mode_cfg = &cpi->oxcf.intra_mode_cfg;

  init_sbuv_mode(mbmi);

  // Return if the current block does not correspond to a chroma block.
  if (!xd->is_chroma_ref) {
    *rate = 0;
    *rate_tokenonly = 0;
    *distortion = 0;
    *skippable = 1;
    return INT64_MAX;
  }

  // Only store reconstructed luma when there's chroma RDO. When there's no
  // chroma RDO, the reconstructed luma will be stored in encode_superblock().
  xd->cfl.store_y = store_cfl_required_rdo(cm, x);
  if (xd->cfl.store_y) {
    // Restore reconstructed luma values.
    // TODO(chiyotsai@google.com): right now we are re-computing the txfm in
    // this function everytime we search through uv modes. There is some
    // potential speed up here if we cache the result to avoid redundant
    // computation.
    av1_encode_intra_block_plane(cpi, x, mbmi->bsize, AOM_PLANE_Y,
                                 DRY_RUN_NORMAL,
                                 cpi->optimize_seg_arr[mbmi->segment_id]);
    xd->cfl.store_y = 0;
  }
  IntraModeSearchState intra_search_state;
  init_intra_mode_search_state(&intra_search_state);
  const CFL_ALLOWED_TYPE cfl_allowed = is_cfl_allowed(xd);

  // Search through all non-palette modes.
  for (int mode_idx = 0; mode_idx < UV_INTRA_MODES; ++mode_idx) {
    int this_rate;
    RD_STATS tokenonly_rd_stats;
    UV_PREDICTION_MODE uv_mode = uv_rd_search_mode_order[mode_idx];

    // Skip the current mode evaluation if the RD cost derived using the mode
    // signaling rate exceeds the best_rd so far.
    const int mode_rate =
        mode_costs->intra_uv_mode_cost[cfl_allowed][mbmi->mode][uv_mode];
    if (RDCOST(x->rdmult, mode_rate, 0) > best_rd) continue;

    PREDICTION_MODE intra_mode = get_uv_mode(uv_mode);
    const int is_diagonal_mode = av1_is_diagonal_mode(intra_mode);
    const int is_directional_mode = av1_is_directional_mode(intra_mode);

    if (is_diagonal_mode && !cpi->oxcf.intra_mode_cfg.enable_diagonal_intra)
      continue;
    if (is_directional_mode &&
        !cpi->oxcf.intra_mode_cfg.enable_directional_intra)
      continue;

    if (!(cpi->sf.intra_sf.intra_uv_mode_mask[txsize_sqr_up_map[max_tx_size]] &
          (1 << uv_mode)))
      continue;
    if (!intra_mode_cfg->enable_smooth_intra && uv_mode >= UV_SMOOTH_PRED &&
        uv_mode <= UV_SMOOTH_H_PRED)
      continue;

    if (!intra_mode_cfg->enable_paeth_intra && uv_mode == UV_PAETH_PRED)
      continue;

    assert(mbmi->mode < INTRA_MODES);
    if (cpi->sf.intra_sf.prune_chroma_modes_using_luma_winner &&
        !(av1_derived_chroma_intra_mode_used_flag[mbmi->mode] & (1 << uv_mode)))
      continue;

    mbmi->uv_mode = uv_mode;

    // Init variables for cfl and angle delta
    const SPEED_FEATURES *sf = &cpi->sf;
    mbmi->angle_delta[PLANE_TYPE_UV] = 0;
    if (uv_mode == UV_CFL_PRED) {
      if (!cfl_allowed || !intra_mode_cfg->enable_cfl_intra) continue;
      assert(!is_directional_mode);
      const TX_SIZE uv_tx_size = av1_get_tx_size(AOM_PLANE_U, xd);
      if (!cfl_rd_pick_alpha(x, cpi, uv_tx_size, best_rd,
                             sf->intra_sf.cfl_search_range, &tokenonly_rd_stats,
                             &mbmi->cfl_alpha_idx, &mbmi->cfl_alpha_signs)) {
        continue;
      }
    } else if (is_directional_mode && av1_use_angle_delta(mbmi->bsize) &&
               intra_mode_cfg->enable_angle_delta) {
      if (sf->intra_sf.chroma_intra_pruning_with_hog &&
          !intra_search_state.dir_mode_skip_mask_ready) {
        static const float thresh[2][4] = {
          { -1.2f, 0.0f, 0.0f, 1.2f },    // Interframe
          { -1.2f, -1.2f, -0.6f, 0.4f },  // Intraframe
        };
        const int is_chroma = 1;
        const int is_intra_frame = frame_is_intra_only(cm);
        prune_intra_mode_with_hog(
            x, bsize, cm->seq_params->sb_size,
            thresh[is_intra_frame]
                  [sf->intra_sf.chroma_intra_pruning_with_hog - 1],
            intra_search_state.directional_mode_skip_mask, is_chroma);
        intra_search_state.dir_mode_skip_mask_ready = 1;
      }
      if (intra_search_state.directional_mode_skip_mask[uv_mode]) {
        continue;
      }

      // Search through angle delta
      const int rate_overhead =
          mode_costs->intra_uv_mode_cost[cfl_allowed][mbmi->mode][uv_mode];
      if (!rd_pick_intra_angle_sbuv(cpi, x, bsize, rate_overhead, best_rd,
                                    &this_rate, &tokenonly_rd_stats))
        continue;
    } else {
      if (uv_mode == UV_SMOOTH_PRED &&
          should_prune_chroma_smooth_pred_based_on_source_variance(cpi, x,
                                                                   bsize))
        continue;

      // Predict directly if we don't need to search for angle delta.
      if (!av1_txfm_uvrd(cpi, x, &tokenonly_rd_stats, bsize, best_rd)) {
        continue;
      }
    }
    const int mode_cost =
        mode_costs->intra_uv_mode_cost[cfl_allowed][mbmi->mode][uv_mode];
    this_rate = tokenonly_rd_stats.rate +
                intra_mode_info_cost_uv(cpi, x, mbmi, bsize, mode_cost);
    this_rd = RDCOST(x->rdmult, this_rate, tokenonly_rd_stats.dist);

    if (this_rd < best_rd) {
      best_mbmi = *mbmi;
      best_rd = this_rd;
      *rate = this_rate;
      *rate_tokenonly = tokenonly_rd_stats.rate;
      *distortion = tokenonly_rd_stats.dist;
      *skippable = tokenonly_rd_stats.skip_txfm;
    }
  }

  // Search palette mode
  const int try_palette =
      cpi->oxcf.tool_cfg.enable_palette &&
      av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                        mbmi->bsize);
  if (try_palette) {
    uint8_t *best_palette_color_map = x->palette_buffer->best_palette_color_map;
    av1_rd_pick_palette_intra_sbuv(
        cpi, x,
        mode_costs->intra_uv_mode_cost[cfl_allowed][mbmi->mode][UV_DC_PRED],
        best_palette_color_map, &best_mbmi, &best_rd, rate, rate_tokenonly,
        distortion, skippable);
  }

  *mbmi = best_mbmi;
  // Make sure we actually chose a mode
  assert(best_rd < INT64_MAX);
  return best_rd;
}